

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

int __thiscall
miniros::TransportTCP::connect(TransportTCP *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pointer pcVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  undefined7 extraout_var;
  char *pcVar7;
  Level LVar8;
  socklen_t __len_00;
  undefined4 in_register_00000034;
  string *host;
  void *pvVar9;
  addrinfo *paVar10;
  ulong uVar11;
  allocator<char> local_2a5;
  in_addr ina;
  addrinfo *addr;
  string local_298;
  undefined1 local_278 [32];
  char *local_258;
  addrinfo *paStack_250;
  in6_addr in6a;
  sockaddr_storage sas;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  
  host = (string *)CONCAT44(in_register_00000034,__fd);
  uVar11 = (ulong)__addr & 0xffffffff;
  bVar3 = Transport::isHostAllowed(&this->super_Transport,host);
  if (!bVar3) {
    return 0;
  }
  iVar4 = socket((uint)s_use_ipv6_ * 8 + 2,1,0);
  this->sock_ = iVar4;
  std::__cxx11::string::_M_assign((string *)&this->connected_host_);
  this->connected_port_ = (int)__addr;
  if (this->sock_ == -1) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (connect::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"miniros.transport_tcp",(allocator<char> *)&sas);
      console::initializeLogLocation(&connect::loc,(string *)&ss,Error);
      std::__cxx11::string::~string((string *)&ss);
    }
    if (connect::loc.level_ != Error) {
      console::setLogLocationLevel(&connect::loc,Error);
      console::checkLogLocationEnabled(&connect::loc);
    }
    pvVar9 = connect::loc.logger_;
    LVar8 = connect::loc.level_;
    if (connect::loc.logger_enabled_ != true) {
      return 0;
    }
    pcVar7 = last_socket_error_string();
    console::print((FilterBase *)0x0,pvVar9,LVar8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                   ,0xf2,"bool miniros::TransportTCP::connect(const std::string &, int)",
                   "socket() failed with error [%s]",pcVar7);
    return 0;
  }
  setNonBlocking(this);
  iVar4 = inet_pton(2,(host->_M_dataplus)._M_p,&ina);
  uVar2 = (ushort)__addr;
  if (iVar4 == 1) {
    this->la_len_ = 0x10;
    sas.ss_family = 2;
    sas.__ss_padding._0_2_ = uVar2 << 8 | uVar2 >> 8;
    sas.__ss_padding[2] = (undefined1)ina.s_addr;
    sas.__ss_padding[3] = ina.s_addr._1_1_;
    sas.__ss_padding[4] = ina.s_addr._2_1_;
    sas.__ss_padding[5] = ina.s_addr._3_1_;
    __len_00 = 0x10;
  }
  else {
    iVar4 = inet_pton(10,(host->_M_dataplus)._M_p,&in6a);
    if (iVar4 != 1) {
      local_258 = (char *)0x0;
      paStack_250 = (addrinfo *)0x0;
      local_278._16_8_ = 0;
      local_278._24_8_ = (sockaddr *)0x0;
      local_278._0_8_ = (pointer)0x0;
      local_278._8_8_ = 0;
      iVar4 = getaddrinfo((host->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)local_278,
                          (addrinfo **)&addr);
      if (iVar4 == 0) {
        __len_00 = 0x10;
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_178 = 0;
        uStack_170 = 0;
        local_188 = 0;
        uStack_180 = 0;
        local_198 = 0;
        uStack_190 = 0;
        local_1a8._M_allocated_capacity = 0;
        local_1a8._8_8_ = 0;
        _ss = (pointer)0x0;
        for (paVar10 = addr; paVar10 != (addrinfo *)0x0; paVar10 = paVar10->ai_next) {
          if ((s_use_ipv6_ & 1) == 0) {
            if (paVar10->ai_family == 2) {
              memcpy(&sas,paVar10->ai_addr,(ulong)paVar10->ai_addrlen);
              sas.ss_family = (sa_family_t)paVar10->ai_family;
              sas.__ss_padding._0_2_ = uVar2 << 8 | uVar2 >> 8;
              pcVar7 = inet_ntoa((in_addr)sas.__ss_padding._2_4_);
              strncpy((char *)&ss,pcVar7,0x7f);
              break;
            }
          }
          else if (paVar10->ai_family == 10) {
            __len_00 = 0x1c;
            memcpy(&sas,paVar10->ai_addr,(ulong)paVar10->ai_addrlen);
            sas.ss_family = (sa_family_t)paVar10->ai_family;
            sas.__ss_padding._0_2_ = uVar2 << 8 | uVar2 >> 8;
            inet_ntop(10,sas.__ss_padding + 6,(char *)&ss,0x80);
            break;
          }
        }
        freeaddrinfo((addrinfo *)addr);
        if (paVar10 != (addrinfo *)0x0) {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_298,"miniros.transport_tcp",&local_2a5);
            console::initializeLogLocation
                      (&connect(std::__cxx11::string_const&,int)::loc,&local_298,Debug);
            std::__cxx11::string::~string((string *)&local_298);
          }
          if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
            console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Debug);
            console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
          }
          if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,connect(std::__cxx11::string_const&,int)::loc.logger_,
                           connect(std::__cxx11::string_const&,int)::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                           ,0x148,"bool miniros::TransportTCP::connect(const std::string &, int)",
                           "Resolved publisher host [%s] to [%s] for socket [%d]",
                           (host->_M_dataplus)._M_p,&ss,(ulong)(uint)this->sock_);
          }
          goto LAB_00265a76;
        }
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,"miniros.transport_tcp",&local_2a5);
          console::initializeLogLocation
                    (&connect(std::__cxx11::string_const&,int)::loc,&local_298,Error);
          std::__cxx11::string::~string((string *)&local_298);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.level_ != Error) {
          console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Error);
          console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ != true) {
          return 0;
        }
        pcVar7 = "Couldn\'t resolve an address for [%s]\n";
        iVar4 = 0x144;
        pvVar9 = connect(std::__cxx11::string_const&,int)::loc.logger_;
        LVar8 = connect(std::__cxx11::string_const&,int)::loc.level_;
      }
      else {
        (*(this->super_Transport)._vptr_Transport[8])();
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"miniros.transport_tcp",(allocator<char> *)&local_298);
          console::initializeLogLocation
                    (&connect(std::__cxx11::string_const&,int)::loc,(string *)&ss,Error);
          std::__cxx11::string::~string((string *)&ss);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.level_ != Error) {
          console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Error);
          console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ != true) {
          return 0;
        }
        pcVar7 = "couldn\'t resolve publisher host [%s]";
        iVar4 = 0x11a;
        pvVar9 = connect(std::__cxx11::string_const&,int)::loc.logger_;
        LVar8 = connect(std::__cxx11::string_const&,int)::loc.level_;
      }
      console::print((FilterBase *)0x0,pvVar9,LVar8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,iVar4,"bool miniros::TransportTCP::connect(const std::string &, int)",pcVar7,
                     (host->_M_dataplus)._M_p);
      return 0;
    }
    this->la_len_ = 0x1c;
    sas.ss_family = 10;
    sas.__ss_padding._0_2_ = uVar2 << 8 | uVar2 >> 8;
    sas.__ss_padding[6] = in6a.__in6_u._0_1_;
    sas.__ss_padding[7] = in6a.__in6_u._1_1_;
    sas.__ss_padding[8] = in6a.__in6_u._2_1_;
    sas.__ss_padding[9] = in6a.__in6_u._3_1_;
    sas.__ss_padding[10] = in6a.__in6_u._4_1_;
    sas.__ss_padding[0xb] = in6a.__in6_u._5_1_;
    sas.__ss_padding[0xc] = in6a.__in6_u._6_1_;
    sas.__ss_padding[0xd] = in6a.__in6_u._7_1_;
    sas.__ss_padding[0xe] = in6a.__in6_u._8_1_;
    sas.__ss_padding[0xf] = in6a.__in6_u._9_1_;
    sas.__ss_padding[0x10] = in6a.__in6_u._10_1_;
    sas.__ss_padding[0x11] = in6a.__in6_u._11_1_;
    sas.__ss_padding[0x12] = in6a.__in6_u._12_1_;
    sas.__ss_padding[0x13] = in6a.__in6_u._13_1_;
    sas.__ss_padding[0x14] = in6a.__in6_u._14_1_;
    sas.__ss_padding[0x15] = in6a.__in6_u._15_1_;
    __len_00 = 0x1c;
  }
LAB_00265a76:
  uVar5 = ::connect(this->sock_,(sockaddr *)&sas,__len_00);
  if ((((byte)this->flags_ & uVar5 != 0) == 0) &&
     (((this->flags_ & 1U) != 0 || uVar5 == 0 || (iVar4 = last_socket_error(), iVar4 == 0x73)))) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<((ostream *)local_1a8._M_local_buf,(string *)host);
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)__addr);
    poVar6 = std::operator<<(poVar6," on socket ");
    std::ostream::operator<<((ostream *)poVar6,this->sock_);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->cached_remote_host_,(string *)local_278);
    std::__cxx11::string::~string((string *)local_278);
    bVar3 = initializeSocket(this);
    if (bVar3) {
      if ((this->flags_ & 1) == 0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_278,"miniros.transport_tcp",(allocator<char> *)&local_298);
          console::initializeLogLocation
                    (&connect(std::__cxx11::string_const&,int)::loc,(string *)local_278,Debug);
          std::__cxx11::string::~string((string *)local_278);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
          console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Debug);
          console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,connect(std::__cxx11::string_const&,int)::loc.logger_,
                         connect(std::__cxx11::string_const&,int)::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                         ,0x16f,"bool miniros::TransportTCP::connect(const std::string &, int)",
                         "Async connect() in progress to [%s:%d] on socket [%d]",
                         (host->_M_dataplus)._M_p,uVar11,(ulong)(uint)this->sock_);
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_278,"miniros.transport_tcp",(allocator<char> *)&local_298);
          console::initializeLogLocation
                    (&connect(std::__cxx11::string_const&,int)::loc,(string *)local_278,Debug);
          std::__cxx11::string::~string((string *)local_278);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
          console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Debug);
          console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
        }
        if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,connect(std::__cxx11::string_const&,int)::loc.logger_,
                         connect(std::__cxx11::string_const&,int)::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                         ,0x16b,"bool miniros::TransportTCP::connect(const std::string &, int)",
                         "connect() succeeded to [%s:%d] on socket [%d]",(host->_M_dataplus)._M_p,
                         uVar11,(ulong)(uint)this->sock_);
        }
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return (int)CONCAT71(extraout_var,bVar3);
  }
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"miniros.transport_tcp",(allocator<char> *)local_278);
    console::initializeLogLocation
              (&connect(std::__cxx11::string_const&,int)::loc,(string *)&ss,Debug);
    std::__cxx11::string::~string((string *)&ss);
  }
  if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
    console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Debug);
    console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
  }
  pvVar9 = connect(std::__cxx11::string_const&,int)::loc.logger_;
  LVar8 = connect(std::__cxx11::string_const&,int)::loc.level_;
  if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
    pcVar1 = (host->_M_dataplus)._M_p;
    pcVar7 = last_socket_error_string();
    console::print((FilterBase *)0x0,pvVar9,LVar8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                   ,0x152,"bool miniros::TransportTCP::connect(const std::string &, int)",
                   "Connect to tcpros publisher [%s:%d] failed with error [%d, %s]",pcVar1,uVar11,
                   (ulong)uVar5,pcVar7);
  }
  (*(this->super_Transport)._vptr_Transport[8])(this);
  return 0;
}

Assistant:

bool TransportTCP::connect(const std::string& host, int port)
{
  if (!isHostAllowed(host))
    return false; // adios amigo

  sock_ = socket(s_use_ipv6_ ? AF_INET6 : AF_INET, SOCK_STREAM, 0);
  connected_host_ = host;
  connected_port_ = port;

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  setNonBlocking();

  sockaddr_storage sas;
  socklen_t sas_len;

  in_addr ina;
  in6_addr in6a;
  if (inet_pton(AF_INET, host.c_str(), &ina) == 1)
  {
    sockaddr_in *address = (sockaddr_in*) &sas;
    sas_len = sizeof(sockaddr_in);
    
    la_len_ = sizeof(sockaddr_in);
    address->sin_family = AF_INET;
    address->sin_port = htons(port);
    address->sin_addr.s_addr = ina.s_addr;
  }
  else if (inet_pton(AF_INET6, host.c_str(), &in6a) == 1)
  {
    sockaddr_in6 *address = (sockaddr_in6*) &sas;
    sas_len = sizeof(sockaddr_in6);
    la_len_ = sizeof(sockaddr_in6);
    address->sin6_family = AF_INET6;
    address->sin6_port = htons(port);
    memcpy(address->sin6_addr.s6_addr, in6a.s6_addr, sizeof(in6a.s6_addr));
  }
  else
  {
    struct addrinfo* addr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;

    if (getaddrinfo(host.c_str(), NULL, &hints, &addr) != 0)
    {
      close();
      MINIROS_ERROR("couldn't resolve publisher host [%s]", host.c_str());
      return false;
    }

    bool found = false;
    struct addrinfo* it = addr;
    char namebuf[128] = {};
    for (; it; it = it->ai_next)
    {
      if (!s_use_ipv6_ && it->ai_family == AF_INET)
      {
        sockaddr_in *address = (sockaddr_in*) &sas;
        sas_len = sizeof(*address);
        
        memcpy(address, it->ai_addr, it->ai_addrlen);
        address->sin_family = it->ai_family;
        address->sin_port = htons(port);
	
        strncpy(namebuf, inet_ntoa(address->sin_addr), sizeof(namebuf)-1);
        found = true;
        break;
      }
      if (s_use_ipv6_ && it->ai_family == AF_INET6)
      {
        sockaddr_in6 *address = (sockaddr_in6*) &sas;
        sas_len = sizeof(*address);
      
        memcpy(address, it->ai_addr, it->ai_addrlen);
        address->sin6_family = it->ai_family;
        address->sin6_port = htons((u_short) port);
      
        // TODO IPV6: does inet_ntop need other includes for Windows?
        inet_ntop(AF_INET6, (void*)&(address->sin6_addr), namebuf, sizeof(namebuf));
        found = true;
        break;
      }
    }

    freeaddrinfo(addr);

    if (!found)
    {
      MINIROS_ERROR("Couldn't resolve an address for [%s]\n", host.c_str());
      return false;
    }

    MINIROS_DEBUG("Resolved publisher host [%s] to [%s] for socket [%d]", host.c_str(), namebuf, sock_);
  }

  int ret = ::connect(sock_, (sockaddr*) &sas, sas_len);
  // windows might need some time to sleep (input from service robotics hack) add this if testing proves it is necessary.
  // MINIROS_ASSERT((flags_ & SYNCHRONOUS) || ret != 0);
  if (((flags_ & SYNCHRONOUS) && ret != 0) || // synchronous, connect() should return 0
      (!(flags_ & SYNCHRONOUS) && ret != 0 && last_socket_error() != ROS_SOCKETS_ASYNCHRONOUS_CONNECT_RETURN)) 
      // asynchronous, connect() may return 0 or -1. When return -1, WSAGetLastError()=WSAEWOULDBLOCK/errno=EINPROGRESS
  {
    MINIROS_DEBUG("Connect to tcpros publisher [%s:%d] failed with error [%d, %s]", host.c_str(), port, ret, last_socket_error_string());
    close();

    return false;
  }

  // from daniel stonier:
#ifdef WIN32
  // This is hackish, but windows fails at recv() if its slow to connect (e.g. happens with wireless)
  // recv() needs to check if its connected or not when its asynchronous?
  Sleep(100);
#endif


  std::stringstream ss;
  ss << host << ":" << port << " on socket " << sock_;
  cached_remote_host_ = ss.str();

  if (!initializeSocket())
  {
    return false;
  }

  if (flags_ & SYNCHRONOUS)
  {
    MINIROS_DEBUG("connect() succeeded to [%s:%d] on socket [%d]", host.c_str(), port, sock_);
  }
  else
  {
    MINIROS_DEBUG("Async connect() in progress to [%s:%d] on socket [%d]", host.c_str(), port, sock_);
  }

  return true;
}